

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_>::SetMemoryIndices
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeTetra>_> *this,TPZVec<long> *indices)

{
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = (uint)indices->fNElements;
  TPZManVector<long,_128>::Resize
            (&(this->fIntPtIndices).super_TPZManVector<long,_128>,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    plVar1 = indices->fStore;
    plVar2 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
    uVar3 = 0;
    do {
      plVar2[uVar3] = plVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetMemoryIndices(TPZVec<int64_t> &indices) {
    int n = indices.size();
    fIntPtIndices.Resize(n);
    for (int i = 0; i < n; i++) {
        fIntPtIndices[i] = indices[i];
    }
}